

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

void __thiscall
duckdb::BaseStringStatsUnifier::UnifyMinMax
          (BaseStringStatsUnifier *this,string *new_min,string *new_max)

{
  bool bVar1;
  string *psVar2;
  string_t local_50;
  string_t local_40;
  
  if ((this->super_ColumnStatsUnifier).min_is_set == false) {
    std::__cxx11::string::_M_assign((string *)&(this->super_ColumnStatsUnifier).global_min);
    (this->super_ColumnStatsUnifier).min_is_set = true;
  }
  else {
    string_t::string_t(&local_40,new_min);
    psVar2 = &(this->super_ColumnStatsUnifier).global_min;
    string_t::string_t(&local_50,psVar2);
    bVar1 = string_t::StringComparisonOperators::GreaterThan(&local_50,&local_40);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)psVar2);
    }
  }
  if ((this->super_ColumnStatsUnifier).max_is_set == false) {
    std::__cxx11::string::_M_assign((string *)&(this->super_ColumnStatsUnifier).global_max);
    (this->super_ColumnStatsUnifier).max_is_set = true;
  }
  else {
    string_t::string_t(&local_40,new_max);
    psVar2 = &(this->super_ColumnStatsUnifier).global_max;
    string_t::string_t(&local_50,psVar2);
    bVar1 = string_t::StringComparisonOperators::GreaterThan(&local_40,&local_50);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)psVar2);
    }
  }
  return;
}

Assistant:

void UnifyMinMax(const string &new_min, const string &new_max) override {
		if (!min_is_set) {
			global_min = new_min;
			min_is_set = true;
		} else {
			if (LessThan::Operation(string_t(new_min), string_t(global_min))) {
				global_min = new_min;
			}
		}
		if (!max_is_set) {
			global_max = new_max;
			max_is_set = true;
		} else {
			if (GreaterThan::Operation(string_t(new_max), string_t(global_max))) {
				global_max = new_max;
			}
		}
	}